

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::applyProtectPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma,
          SmallVectorBase<slang::parsing::Token> *skippedTokens)

{
  Token keyword;
  Token keyword_00;
  bool bVar1;
  size_type delta;
  SyntaxNode *this_00;
  SimplePragmaExpressionSyntax *pSVar2;
  NameValuePragmaExpressionSyntax *pNVar3;
  PragmaExpressionSyntax *args;
  SourceRange range;
  NameValuePragmaExpressionSyntax *nvp;
  SimplePragmaExpressionSyntax *simple;
  PragmaExpressionSyntax *arg;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  anon_class_16_2_cfeedcd7 handle;
  SourceLocation local_48;
  SourceLocation local_40;
  DiagCode local_34;
  undefined1 local_30 [8];
  Token last;
  SmallVectorBase<slang::parsing::Token> *skippedTokens_local;
  PragmaDirectiveSyntax *pragma_local;
  Preprocessor *this_local;
  
  last.info = (Info *)skippedTokens;
  bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::empty
                    (&pragma->args);
  if (bVar1) {
    _local_30 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)pragma);
    local_34.subsystem = Preprocessor;
    local_34.code = 0x20;
    local_48 = Token::location((Token *)local_30);
    join_0x00000010_0x00000000_ = Token::rawText((Token *)local_30);
    delta = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&handle.skippedTokens);
    local_40 = SourceLocation::operator+(&local_48,delta);
    addDiag(this,local_34,local_40);
  }
  else {
    handle.this = (Preprocessor *)last.info;
    __range2 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)this;
    join_0x00000010_0x00000000_ =
         slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::begin
                   (&pragma->args);
    _arg = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::end
                     (&pragma->args);
    while (bVar1 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                   ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                                 *)&__end2.index,
                                (iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)&arg
                               ), bVar1) {
      this_00 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                 iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::operator*
                           ((iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)
                            &__end2.index)->super_SyntaxNode;
      if (this_00->kind == SimplePragmaExpression) {
        pSVar2 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>(this_00)
        ;
        if (((pSVar2->value).kind == Identifier) ||
           (bVar1 = LexerFacts::isKeyword((pSVar2->value).kind), bVar1)) {
          keyword.kind = (pSVar2->value).kind;
          keyword._2_1_ = (pSVar2->value).field_0x2;
          keyword.numFlags.raw = (pSVar2->value).numFlags.raw;
          keyword.rawLen = (pSVar2->value).rawLen;
          keyword.info = (pSVar2->value).info;
          applyProtectPragma::anon_class_16_2_cfeedcd7::operator()
                    ((anon_class_16_2_cfeedcd7 *)&__range2,keyword,(PragmaExpressionSyntax *)0x0);
        }
        else {
LAB_0025103f:
          range = slang::syntax::SyntaxNode::sourceRange(this_00);
          addDiag(this,(DiagCode)0x200004,range);
        }
      }
      else {
        if (this_00->kind != NameValuePragmaExpression) goto LAB_0025103f;
        pNVar3 = slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>
                           (this_00);
        keyword_00.kind = (pNVar3->name).kind;
        keyword_00._2_1_ = (pNVar3->name).field_0x2;
        keyword_00.numFlags.raw = (pNVar3->name).numFlags.raw;
        keyword_00.rawLen = (pNVar3->name).rawLen;
        keyword_00.info = (pNVar3->name).info;
        args = not_null::operator_cast_to_PragmaExpressionSyntax_((not_null *)&pNVar3->value);
        applyProtectPragma::anon_class_16_2_cfeedcd7::operator()
                  ((anon_class_16_2_cfeedcd7 *)&__range2,keyword_00,args);
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
      ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                    *)&__end2.index);
    }
  }
  return;
}

Assistant:

void Preprocessor::applyProtectPragma(const PragmaDirectiveSyntax& pragma,
                                      SmallVectorBase<Token>& skippedTokens) {
    if (pragma.args.empty()) {
        Token last = pragma.getLastToken();
        addDiag(diag::ExpectedProtectKeyword, last.location() + last.rawText().length());
        return;
    }

    auto handle = [&](Token keyword, const PragmaExpressionSyntax* args) {
        auto text = keyword.valueText();
        if (auto it = pragmaProtectHandlers.find(text); it != pragmaProtectHandlers.end())
            (this->*(it->second))(keyword, args, skippedTokens);
        else if (!text.empty())
            addDiag(diag::UnknownProtectKeyword, keyword.range()) << text;
    };

    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            if (simple.value.kind == TokenKind::Identifier ||
                LexerFacts::isKeyword(simple.value.kind)) {
                handle(simple.value, nullptr);
                continue;
            }
        }
        else if (arg->kind == SyntaxKind::NameValuePragmaExpression) {
            auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
            handle(nvp.name, nvp.value);
            continue;
        }

        addDiag(diag::ExpectedProtectKeyword, arg->sourceRange());
    }
}